

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.cpp
# Opt level: O2

string * __thiscall
groundupdb::BucketQuery::bucket_abi_cxx11_(string *__return_storage_ptr__,BucketQuery *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             (this->mImpl)._M_t.
             super___uniq_ptr_impl<groundupdb::BucketQuery::Impl,_std::default_delete<groundupdb::BucketQuery::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_groundupdb::BucketQuery::Impl_*,_std::default_delete<groundupdb::BucketQuery::Impl>_>
             .super__Head_base<0UL,_groundupdb::BucketQuery::Impl_*,_false>._M_head_impl);
  return __return_storage_ptr__;
}

Assistant:

std::string
BucketQuery::bucket() const {
  return mImpl->m_bucket;
}